

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O1

size_t __thiscall
kws::Parser::FindClosingChar
          (Parser *this,char openChar,char closeChar,size_t pos,bool noComment,string *buffer)

{
  char cVar1;
  pointer pcVar2;
  char *pcVar3;
  pointer ppVar4;
  pointer ppVar5;
  bool bVar6;
  bool bVar7;
  pointer ppVar8;
  long lVar9;
  const_iterator itLS;
  pointer ppVar10;
  char *pcVar11;
  string stream;
  undefined1 *local_58;
  char *local_50;
  undefined1 local_48 [16];
  pointer local_38;
  
  local_58 = local_48;
  pcVar2 = (buffer->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + buffer->_M_string_length);
  pcVar11 = local_50;
  if (buffer->_M_string_length == 0) {
    pcVar3 = (this->m_Buffer)._M_dataplus._M_p;
    strlen(pcVar3);
    std::__cxx11::string::_M_replace((ulong)&local_58,0,pcVar11,(ulong)pcVar3);
    pcVar11 = local_50;
    if (noComment) {
      pcVar3 = (this->m_BufferNoComment)._M_dataplus._M_p;
      strlen(pcVar3);
      std::__cxx11::string::_M_replace((ulong)&local_58,0,pcVar11,(ulong)pcVar3);
    }
  }
  local_38 = (this->m_IfElseEndifList).
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppVar4 = (this->m_CommentPositions).
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar5 = (this->m_CommentPositions).
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar9 = 1;
  do {
    pos = pos + 1;
    if (local_50 <= pos) {
      pos = 0xffffffffffffffff;
      break;
    }
    cVar1 = local_58[pos];
    if (cVar1 == openChar || cVar1 == closeChar) {
      bVar7 = false;
      ppVar10 = local_38;
      do {
        if (ppVar10 ==
            (this->m_IfElseEndifList).
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) break;
        pcVar11 = (char *)pos;
        ppVar8 = ppVar4;
        if (noComment && ppVar4 != ppVar5) {
          do {
            if (pos < (char *)ppVar8->first) break;
            pcVar11 = (char *)ppVar8->first + (long)pcVar11 + -ppVar8->second;
            ppVar8 = ppVar8 + 1;
          } while (ppVar8 != ppVar5);
        }
        if (((char *)ppVar10->first < pcVar11) && (pcVar11 < (char *)ppVar10->second)) {
          bVar7 = true;
          bVar6 = false;
        }
        else {
          ppVar10 = ppVar10 + 1;
          bVar6 = true;
        }
      } while (bVar6);
      if (!bVar7) {
        if (cVar1 == openChar) {
          lVar9 = lVar9 + 1;
        }
        else {
          lVar9 = lVar9 - (ulong)(cVar1 == closeChar);
        }
      }
    }
  } while (lVar9 != 0);
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  return (size_t)(char *)pos;
}

Assistant:

size_t Parser::FindClosingChar(char openChar, char closeChar,
                               size_t pos,bool noComment,std::string buffer) const
{
  std::string stream = buffer;
  if (buffer.empty()) {
    stream = m_Buffer.c_str();
    if(noComment)
      {
      stream = m_BufferNoComment.c_str();
      }
  }

  size_t open = 1;
  for(size_t i=pos+1;i<stream.length();i++)
    {
    if(stream[i] == openChar || stream[i] == closeChar)
      {
      bool skip = false;
      // We want to check that we are not in the #if/#else/#endif thing
      auto itLS = m_IfElseEndifList.begin();
      while(itLS != m_IfElseEndifList.end())
        {
        size_t j = i;
        if(noComment)
          {
          j = this->GetPositionWithoutComments(i);
          }
        if(j>(*itLS).first && j<(*itLS).second)
          {
          skip = true;
          break;
          }
        itLS++;
        }

      if(!skip)
        {
        if(stream[i] == openChar)
          {
          open++;
          }
        else if(stream[i] == closeChar)
          {
          open--;
          }
        }
      }
    if(open == 0)
      {
      return i;
      }
    }
  return std::string::npos; // closing char not found
}